

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.h
# Opt level: O0

DiagnosticStream * __thiscall
spvtools::AssemblyContext::diagnostic
          (DiagnosticStream *__return_storage_ptr__,AssemblyContext *this,spv_result_t error)

{
  spv_position_t position;
  allocator<char> local_59;
  string local_58;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  spv_result_t local_1c;
  AssemblyContext *pAStack_18;
  spv_result_t error_local;
  AssemblyContext *this_local;
  
  local_38 = (this->current_position_).line;
  local_30 = (this->current_position_).column;
  local_28 = (this->current_position_).index;
  local_1c = error;
  pAStack_18 = this;
  this_local = (AssemblyContext *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  position.column = local_30;
  position.line = local_38;
  position.index = local_28;
  DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position,&this->consumer_,&local_58,local_1c);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

DiagnosticStream diagnostic(spv_result_t error) {
    return DiagnosticStream(current_position_, consumer_, "", error);
  }